

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O3

void Fra_FramesAddMore(Aig_Man_t *p,int nFrames)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  uint uVar4;
  undefined8 *__ptr;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  Aig_Obj_t *p1;
  int iVar11;
  ulong uVar12;
  int iVar13;
  undefined8 *puVar14;
  Aig_Obj_t *pAVar15;
  ulong uVar16;
  int iVar17;
  
  pVVar6 = p->vObjs;
  iVar11 = pVVar6->nSize;
  if (0 < iVar11) {
    lVar7 = 0;
    do {
      pvVar3 = pVVar6->pArray[lVar7];
      if (pvVar3 != (void *)0x0) {
        *(void **)((long)pvVar3 + 0x28) = pvVar3;
        pVVar6 = p->vObjs;
      }
      lVar7 = lVar7 + 1;
      iVar11 = pVVar6->nSize;
    } while (lVar7 < iVar11);
  }
  __ptr = (undefined8 *)malloc((long)p->nRegs << 3);
  if (0 < nFrames) {
    iVar17 = 0;
    do {
      iVar9 = p->nRegs;
      uVar4 = p->nObjs[3] - iVar9;
      pVVar6 = p->vCos;
      if ((int)uVar4 < pVVar6->nSize) {
        uVar10 = (ulong)uVar4;
        do {
          if ((int)uVar4 < 0) goto LAB_00603d47;
          *(undefined8 *)((long)pVVar6->pArray[uVar10] + 0x28) = 0;
          uVar10 = uVar10 + 1;
          pVVar6 = p->vCos;
        } while ((int)uVar10 < pVVar6->nSize);
        iVar9 = p->nRegs;
      }
      uVar4 = p->nObjs[2] - iVar9;
      pVVar5 = p->vCis;
      iVar13 = pVVar5->nSize;
      if ((int)uVar4 < iVar13) {
        uVar10 = (ulong)uVar4;
        do {
          if ((int)uVar4 < 0) goto LAB_00603d47;
          *(undefined8 *)((long)pVVar5->pArray[uVar10] + 0x28) = 0;
          uVar10 = uVar10 + 1;
          pVVar5 = p->vCis;
          iVar13 = pVVar5->nSize;
        } while ((int)uVar10 < iVar13);
        iVar9 = p->nRegs;
        pVVar6 = p->vCos;
      }
      iVar1 = p->nObjs[3];
      uVar4 = iVar1 - iVar9;
      iVar2 = pVVar6->nSize;
      if ((int)uVar4 < iVar2) {
        uVar10 = 0;
        do {
          if ((int)uVar4 < 0) goto LAB_00603d47;
          uVar8 = *(ulong *)((long)pVVar6->pArray[uVar4 + uVar10] + 8);
          uVar12 = uVar8 & 0xfffffffffffffffe;
          uVar16 = *(ulong *)(uVar12 + 0x28);
          if (uVar16 == 0) {
            uVar16 = 0;
          }
          else {
            if (((ulong)pVVar6->pArray[uVar4 + uVar10] & 1) != 0) goto LAB_00603d66;
            uVar16 = (uint)uVar8 & 1 ^ uVar16;
            if (uVar12 == 0) {
              uVar16 = 0;
            }
          }
          __ptr[uVar10] = uVar16;
          uVar10 = uVar10 + 1;
        } while ((uint)((iVar2 + iVar9) - iVar1) != uVar10);
      }
      uVar4 = p->nObjs[2] - iVar9;
      if ((int)uVar4 < iVar13) {
        uVar10 = (ulong)uVar4;
        puVar14 = __ptr;
        do {
          if ((int)uVar4 < 0) {
LAB_00603d47:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          *(undefined8 *)((long)pVVar5->pArray[uVar10] + 0x28) = *puVar14;
          uVar10 = uVar10 + 1;
          pVVar5 = p->vCis;
          puVar14 = puVar14 + 1;
        } while ((int)uVar10 < pVVar5->nSize);
      }
      pVVar6 = p->vObjs;
      if (0 < pVVar6->nSize) {
        lVar7 = 0;
        do {
          pvVar3 = pVVar6->pArray[lVar7];
          if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
            if (iVar11 < lVar7) break;
            uVar8 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
            uVar10 = *(ulong *)(uVar8 + 0x28);
            if (uVar10 == 0) {
LAB_00603cf5:
              pAVar15 = (Aig_Obj_t *)0x0;
            }
            else {
              uVar12 = *(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe;
              uVar16 = *(ulong *)(uVar12 + 0x28);
              if (uVar16 == 0) goto LAB_00603cf5;
              if (((ulong)pvVar3 & 1) != 0) {
LAB_00603d66:
                __assert_fail("!Aig_IsComplement(pObj)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                              ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
              }
              pAVar15 = (Aig_Obj_t *)((uint)*(ulong *)((long)pvVar3 + 8) & 1 ^ uVar10);
              if (uVar8 == 0) {
                pAVar15 = (Aig_Obj_t *)0x0;
              }
              p1 = (Aig_Obj_t *)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1 ^ uVar16);
              if (uVar12 == 0) {
                p1 = (Aig_Obj_t *)0x0;
              }
              pAVar15 = Aig_And(p,pAVar15,p1);
            }
            *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar15;
          }
          lVar7 = lVar7 + 1;
          pVVar6 = p->vObjs;
        } while (lVar7 < pVVar6->nSize);
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 != nFrames);
  }
  if (__ptr == (undefined8 *)0x0) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

void Fra_FramesAddMore( Aig_Man_t * p, int nFrames )
{
    Aig_Obj_t * pObj, ** pLatches;
    int i, k, f, nNodesOld;
    // set copy pointer of each object to point to itself
    Aig_ManForEachObj( p, pObj, i )
        pObj->pData = pObj;
    // iterate and add objects
    nNodesOld = Aig_ManObjNumMax(p);
    pLatches = ABC_ALLOC( Aig_Obj_t *, Aig_ManRegNum(p) );
    for ( f = 0; f < nFrames; f++ )
    {
        // clean latch inputs and outputs
        Aig_ManForEachLiSeq( p, pObj, i )
            pObj->pData = NULL;
        Aig_ManForEachLoSeq( p, pObj, i )
            pObj->pData = NULL;
        // save the latch input values
        k = 0;
        Aig_ManForEachLiSeq( p, pObj, i )
        {
            if ( Aig_ObjFanin0(pObj)->pData )
                pLatches[k++] = Aig_ObjChild0Copy(pObj);
            else
                pLatches[k++] = NULL;
        }
        // insert them as the latch output values
        k = 0;
        Aig_ManForEachLoSeq( p, pObj, i )
            pObj->pData = pLatches[k++];
        // create the next time frame of nodes
        Aig_ManForEachNode( p, pObj, i )
        {
            if ( i > nNodesOld )
                break;
            if ( Aig_ObjFanin0(pObj)->pData && Aig_ObjFanin1(pObj)->pData )
                pObj->pData = Aig_And( p, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
            else
                pObj->pData = NULL;
        }
    }
    ABC_FREE( pLatches );
}